

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chrono-test.cc
# Opt level: O2

void __thiscall ChronoTest_InvalidSpecs_Test::TestBody(ChronoTest_InvalidSpecs_Test *this)

{
  bool bVar1;
  duration<long,_std::ratio<1L,_1L>_> *in_RCX;
  duration<long,_std::ratio<1L,_1L>_> *pdVar2;
  char *pcVar3;
  AssertHelper AStack_2b8;
  AssertionResult gtest_ar;
  string gtest_expected_message;
  seconds sec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  sec.__r = 0;
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,"no date",(allocator *)&AStack_2b8);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      fmt::v5::format<char[6],std::chrono::duration<long,std::ratio<1l,1l>>>
                (&local_38,(v5 *)"{:%a}",(char (*) [6])&sec,in_RCX);
      std::__cxx11::string::~string((string *)&local_38);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [112])
               "Expected: fmt::format(\"{:%a}\", sec) throws an exception of type fmt::format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar3 = "";
  }
  else {
    pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  pdVar2 = (duration<long,_std::ratio<1L,_1L>_> *)0x8a;
  testing::internal::AssertHelper::AssertHelper
            (&AStack_2b8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
             ,0x8a,pcVar3);
  testing::internal::AssertHelper::operator=(&AStack_2b8,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper(&AStack_2b8);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,"no date",(allocator *)&AStack_2b8);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      fmt::v5::format<char[6],std::chrono::duration<long,std::ratio<1l,1l>>>
                (&local_58,(v5 *)"{:%A}",(char (*) [6])&sec,pdVar2);
      std::__cxx11::string::~string((string *)&local_58);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [112])
               "Expected: fmt::format(\"{:%A}\", sec) throws an exception of type fmt::format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar3 = "";
  }
  else {
    pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  pdVar2 = (duration<long,_std::ratio<1L,_1L>_> *)0x8b;
  testing::internal::AssertHelper::AssertHelper
            (&AStack_2b8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
             ,0x8b,pcVar3);
  testing::internal::AssertHelper::operator=(&AStack_2b8,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper(&AStack_2b8);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,"no date",(allocator *)&AStack_2b8);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      fmt::v5::format<char[6],std::chrono::duration<long,std::ratio<1l,1l>>>
                (&local_78,(v5 *)"{:%c}",(char (*) [6])&sec,pdVar2);
      std::__cxx11::string::~string((string *)&local_78);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [112])
               "Expected: fmt::format(\"{:%c}\", sec) throws an exception of type fmt::format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar3 = "";
  }
  else {
    pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  pdVar2 = (duration<long,_std::ratio<1L,_1L>_> *)0x8c;
  testing::internal::AssertHelper::AssertHelper
            (&AStack_2b8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
             ,0x8c,pcVar3);
  testing::internal::AssertHelper::operator=(&AStack_2b8,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper(&AStack_2b8);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,"no date",(allocator *)&AStack_2b8);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      fmt::v5::format<char[6],std::chrono::duration<long,std::ratio<1l,1l>>>
                (&local_98,(v5 *)"{:%x}",(char (*) [6])&sec,pdVar2);
      std::__cxx11::string::~string((string *)&local_98);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [112])
               "Expected: fmt::format(\"{:%x}\", sec) throws an exception of type fmt::format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar3 = "";
  }
  else {
    pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  pdVar2 = (duration<long,_std::ratio<1L,_1L>_> *)0x8d;
  testing::internal::AssertHelper::AssertHelper
            (&AStack_2b8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
             ,0x8d,pcVar3);
  testing::internal::AssertHelper::operator=(&AStack_2b8,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper(&AStack_2b8);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,"no date",(allocator *)&AStack_2b8);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      fmt::v5::format<char[7],std::chrono::duration<long,std::ratio<1l,1l>>>
                (&local_b8,(v5 *)"{:%Ex}",(char (*) [7])&sec,pdVar2);
      std::__cxx11::string::~string((string *)&local_b8);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [113])
               "Expected: fmt::format(\"{:%Ex}\", sec) throws an exception of type fmt::format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar3 = "";
  }
  else {
    pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  pdVar2 = (duration<long,_std::ratio<1L,_1L>_> *)0x8e;
  testing::internal::AssertHelper::AssertHelper
            (&AStack_2b8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
             ,0x8e,pcVar3);
  testing::internal::AssertHelper::operator=(&AStack_2b8,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper(&AStack_2b8);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,"no date",(allocator *)&AStack_2b8);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      fmt::v5::format<char[6],std::chrono::duration<long,std::ratio<1l,1l>>>
                (&local_d8,(v5 *)"{:%X}",(char (*) [6])&sec,pdVar2);
      std::__cxx11::string::~string((string *)&local_d8);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [112])
               "Expected: fmt::format(\"{:%X}\", sec) throws an exception of type fmt::format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar3 = "";
  }
  else {
    pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  pdVar2 = (duration<long,_std::ratio<1L,_1L>_> *)0x8f;
  testing::internal::AssertHelper::AssertHelper
            (&AStack_2b8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
             ,0x8f,pcVar3);
  testing::internal::AssertHelper::operator=(&AStack_2b8,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper(&AStack_2b8);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,"no date",(allocator *)&AStack_2b8);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      fmt::v5::format<char[7],std::chrono::duration<long,std::ratio<1l,1l>>>
                (&local_f8,(v5 *)"{:%EX}",(char (*) [7])&sec,pdVar2);
      std::__cxx11::string::~string((string *)&local_f8);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [113])
               "Expected: fmt::format(\"{:%EX}\", sec) throws an exception of type fmt::format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar3 = "";
  }
  else {
    pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  pdVar2 = (duration<long,_std::ratio<1L,_1L>_> *)0x90;
  testing::internal::AssertHelper::AssertHelper
            (&AStack_2b8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
             ,0x90,pcVar3);
  testing::internal::AssertHelper::operator=(&AStack_2b8,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper(&AStack_2b8);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,"no date",(allocator *)&AStack_2b8);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      fmt::v5::format<char[6],std::chrono::duration<long,std::ratio<1l,1l>>>
                (&local_118,(v5 *)"{:%D}",(char (*) [6])&sec,pdVar2);
      std::__cxx11::string::~string((string *)&local_118);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [112])
               "Expected: fmt::format(\"{:%D}\", sec) throws an exception of type fmt::format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar3 = "";
  }
  else {
    pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  pdVar2 = (duration<long,_std::ratio<1L,_1L>_> *)0x91;
  testing::internal::AssertHelper::AssertHelper
            (&AStack_2b8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
             ,0x91,pcVar3);
  testing::internal::AssertHelper::operator=(&AStack_2b8,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper(&AStack_2b8);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,"no date",(allocator *)&AStack_2b8);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      fmt::v5::format<char[6],std::chrono::duration<long,std::ratio<1l,1l>>>
                (&local_138,(v5 *)"{:%F}",(char (*) [6])&sec,pdVar2);
      std::__cxx11::string::~string((string *)&local_138);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [112])
               "Expected: fmt::format(\"{:%F}\", sec) throws an exception of type fmt::format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar3 = "";
  }
  else {
    pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  pdVar2 = (duration<long,_std::ratio<1L,_1L>_> *)0x92;
  testing::internal::AssertHelper::AssertHelper
            (&AStack_2b8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
             ,0x92,pcVar3);
  testing::internal::AssertHelper::operator=(&AStack_2b8,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper(&AStack_2b8);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,"no date",(allocator *)&AStack_2b8);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      fmt::v5::format<char[7],std::chrono::duration<long,std::ratio<1l,1l>>>
                (&local_158,(v5 *)"{:%Ec}",(char (*) [7])&sec,pdVar2);
      std::__cxx11::string::~string((string *)&local_158);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [113])
               "Expected: fmt::format(\"{:%Ec}\", sec) throws an exception of type fmt::format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar3 = "";
  }
  else {
    pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  pdVar2 = (duration<long,_std::ratio<1L,_1L>_> *)0x93;
  testing::internal::AssertHelper::AssertHelper
            (&AStack_2b8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
             ,0x93,pcVar3);
  testing::internal::AssertHelper::operator=(&AStack_2b8,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper(&AStack_2b8);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,"no date",(allocator *)&AStack_2b8);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      fmt::v5::format<char[6],std::chrono::duration<long,std::ratio<1l,1l>>>
                (&local_178,(v5 *)"{:%w}",(char (*) [6])&sec,pdVar2);
      std::__cxx11::string::~string((string *)&local_178);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [112])
               "Expected: fmt::format(\"{:%w}\", sec) throws an exception of type fmt::format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar3 = "";
  }
  else {
    pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  pdVar2 = (duration<long,_std::ratio<1L,_1L>_> *)0x94;
  testing::internal::AssertHelper::AssertHelper
            (&AStack_2b8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
             ,0x94,pcVar3);
  testing::internal::AssertHelper::operator=(&AStack_2b8,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper(&AStack_2b8);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,"no date",(allocator *)&AStack_2b8);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      fmt::v5::format<char[6],std::chrono::duration<long,std::ratio<1l,1l>>>
                (&local_198,(v5 *)"{:%u}",(char (*) [6])&sec,pdVar2);
      std::__cxx11::string::~string((string *)&local_198);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [112])
               "Expected: fmt::format(\"{:%u}\", sec) throws an exception of type fmt::format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar3 = "";
  }
  else {
    pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  pdVar2 = (duration<long,_std::ratio<1L,_1L>_> *)0x95;
  testing::internal::AssertHelper::AssertHelper
            (&AStack_2b8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
             ,0x95,pcVar3);
  testing::internal::AssertHelper::operator=(&AStack_2b8,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper(&AStack_2b8);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,"no date",(allocator *)&AStack_2b8);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      fmt::v5::format<char[6],std::chrono::duration<long,std::ratio<1l,1l>>>
                (&local_1b8,(v5 *)"{:%b}",(char (*) [6])&sec,pdVar2);
      std::__cxx11::string::~string((string *)&local_1b8);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [112])
               "Expected: fmt::format(\"{:%b}\", sec) throws an exception of type fmt::format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar3 = "";
  }
  else {
    pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  pdVar2 = (duration<long,_std::ratio<1L,_1L>_> *)0x96;
  testing::internal::AssertHelper::AssertHelper
            (&AStack_2b8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
             ,0x96,pcVar3);
  testing::internal::AssertHelper::operator=(&AStack_2b8,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper(&AStack_2b8);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,"no date",(allocator *)&AStack_2b8);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      fmt::v5::format<char[6],std::chrono::duration<long,std::ratio<1l,1l>>>
                (&local_1d8,(v5 *)"{:%B}",(char (*) [6])&sec,pdVar2);
      std::__cxx11::string::~string((string *)&local_1d8);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [112])
               "Expected: fmt::format(\"{:%B}\", sec) throws an exception of type fmt::format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar3 = "";
  }
  else {
    pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  pdVar2 = (duration<long,_std::ratio<1L,_1L>_> *)0x97;
  testing::internal::AssertHelper::AssertHelper
            (&AStack_2b8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
             ,0x97,pcVar3);
  testing::internal::AssertHelper::operator=(&AStack_2b8,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper(&AStack_2b8);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,"no date",(allocator *)&AStack_2b8);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      fmt::v5::format<char[6],std::chrono::duration<long,std::ratio<1l,1l>>>
                (&local_1f8,(v5 *)"{:%z}",(char (*) [6])&sec,pdVar2);
      std::__cxx11::string::~string((string *)&local_1f8);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [112])
               "Expected: fmt::format(\"{:%z}\", sec) throws an exception of type fmt::format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar3 = "";
  }
  else {
    pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  pdVar2 = (duration<long,_std::ratio<1L,_1L>_> *)0x98;
  testing::internal::AssertHelper::AssertHelper
            (&AStack_2b8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
             ,0x98,pcVar3);
  testing::internal::AssertHelper::operator=(&AStack_2b8,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper(&AStack_2b8);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,"no date",(allocator *)&AStack_2b8);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      fmt::v5::format<char[6],std::chrono::duration<long,std::ratio<1l,1l>>>
                (&local_218,(v5 *)"{:%Z}",(char (*) [6])&sec,pdVar2);
      std::__cxx11::string::~string((string *)&local_218);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [112])
               "Expected: fmt::format(\"{:%Z}\", sec) throws an exception of type fmt::format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar3 = "";
  }
  else {
    pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  pdVar2 = (duration<long,_std::ratio<1L,_1L>_> *)0x99;
  testing::internal::AssertHelper::AssertHelper
            (&AStack_2b8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
             ,0x99,pcVar3);
  testing::internal::AssertHelper::operator=(&AStack_2b8,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper(&AStack_2b8);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,"invalid format",(allocator *)&AStack_2b8);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      fmt::v5::format<char[6],std::chrono::duration<long,std::ratio<1l,1l>>>
                (&local_238,(v5 *)"{:%q}",(char (*) [6])&sec,pdVar2);
      std::__cxx11::string::~string((string *)&local_238);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [112])
               "Expected: fmt::format(\"{:%q}\", sec) throws an exception of type fmt::format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar3 = "";
  }
  else {
    pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  pdVar2 = (duration<long,_std::ratio<1L,_1L>_> *)0x9b;
  testing::internal::AssertHelper::AssertHelper
            (&AStack_2b8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
             ,0x9b,pcVar3);
  testing::internal::AssertHelper::operator=(&AStack_2b8,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper(&AStack_2b8);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,"invalid format",(allocator *)&AStack_2b8);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      fmt::v5::format<char[7],std::chrono::duration<long,std::ratio<1l,1l>>>
                (&local_258,(v5 *)"{:%Eq}",(char (*) [7])&sec,pdVar2);
      std::__cxx11::string::~string((string *)&local_258);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [113])
               "Expected: fmt::format(\"{:%Eq}\", sec) throws an exception of type fmt::format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar3 = "";
  }
  else {
    pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  pdVar2 = (duration<long,_std::ratio<1L,_1L>_> *)0x9d;
  testing::internal::AssertHelper::AssertHelper
            (&AStack_2b8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
             ,0x9d,pcVar3);
  testing::internal::AssertHelper::operator=(&AStack_2b8,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper(&AStack_2b8);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,"invalid format",(allocator *)&AStack_2b8);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      fmt::v5::format<char[7],std::chrono::duration<long,std::ratio<1l,1l>>>
                (&local_278,(v5 *)"{:%Oq}",(char (*) [7])&sec,pdVar2);
      std::__cxx11::string::~string((string *)&local_278);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [113])
               "Expected: fmt::format(\"{:%Oq}\", sec) throws an exception of type fmt::format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar3 = "";
  }
  else {
    pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&AStack_2b8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/chrono-test.cc"
             ,0x9f,pcVar3);
  testing::internal::AssertHelper::operator=(&AStack_2b8,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper(&AStack_2b8);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(ChronoTest, InvalidSpecs) {
  auto sec = std::chrono::seconds(0);
  EXPECT_THROW_MSG(fmt::format("{:%a}", sec), fmt::format_error, "no date");
  EXPECT_THROW_MSG(fmt::format("{:%A}", sec), fmt::format_error, "no date");
  EXPECT_THROW_MSG(fmt::format("{:%c}", sec), fmt::format_error, "no date");
  EXPECT_THROW_MSG(fmt::format("{:%x}", sec), fmt::format_error, "no date");
  EXPECT_THROW_MSG(fmt::format("{:%Ex}", sec), fmt::format_error, "no date");
  EXPECT_THROW_MSG(fmt::format("{:%X}", sec), fmt::format_error, "no date");
  EXPECT_THROW_MSG(fmt::format("{:%EX}", sec), fmt::format_error, "no date");
  EXPECT_THROW_MSG(fmt::format("{:%D}", sec), fmt::format_error, "no date");
  EXPECT_THROW_MSG(fmt::format("{:%F}", sec), fmt::format_error, "no date");
  EXPECT_THROW_MSG(fmt::format("{:%Ec}", sec), fmt::format_error, "no date");
  EXPECT_THROW_MSG(fmt::format("{:%w}", sec), fmt::format_error, "no date");
  EXPECT_THROW_MSG(fmt::format("{:%u}", sec), fmt::format_error, "no date");
  EXPECT_THROW_MSG(fmt::format("{:%b}", sec), fmt::format_error, "no date");
  EXPECT_THROW_MSG(fmt::format("{:%B}", sec), fmt::format_error, "no date");
  EXPECT_THROW_MSG(fmt::format("{:%z}", sec), fmt::format_error, "no date");
  EXPECT_THROW_MSG(fmt::format("{:%Z}", sec), fmt::format_error, "no date");
  EXPECT_THROW_MSG(fmt::format("{:%q}", sec), fmt::format_error,
                   "invalid format");
  EXPECT_THROW_MSG(fmt::format("{:%Eq}", sec), fmt::format_error,
                   "invalid format");
  EXPECT_THROW_MSG(fmt::format("{:%Oq}", sec), fmt::format_error,
                   "invalid format");
}